

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

vector<UniValue,_std::allocator<UniValue>_> *
JSONRPCProcessBatchReply
          (vector<UniValue,_std::allocator<UniValue>_> *__return_storage_ptr__,UniValue *in)

{
  pointer pUVar1;
  int iVar2;
  size_type __n;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar3;
  UniValue *this;
  runtime_error *prVar4;
  pointer this_00;
  long in_FS_OFFSET;
  allocator<char> local_59;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in->typ == VARR) {
    __n = ((long)(in->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(in->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x58;
    std::vector<UniValue,_std::allocator<UniValue>_>::vector
              (__return_storage_ptr__,__n,(allocator_type *)&local_58);
    pvVar3 = UniValue::getValues(in);
    pUVar1 = (pvVar3->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_00 = (pvVar3->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pUVar1; this_00 = this_00 + 1) {
      if (this_00->typ != VOBJ) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Batch member must be an object");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_002f495d;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"id",&local_59);
      this = UniValue::operator[](this_00,&local_58);
      iVar2 = UniValue::getInt<int>(this);
      std::__cxx11::string::~string((string *)&local_58);
      if (__n <= (ulong)(long)iVar2) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Batch member id is larger than batch size");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_002f495d;
      }
      UniValue::operator=((__return_storage_ptr__->
                          super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar2,this_00);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Batch must be an array");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_002f495d:
  __stack_chk_fail();
}

Assistant:

std::vector<UniValue> JSONRPCProcessBatchReply(const UniValue& in)
{
    if (!in.isArray()) {
        throw std::runtime_error("Batch must be an array");
    }
    const size_t num {in.size()};
    std::vector<UniValue> batch(num);
    for (const UniValue& rec : in.getValues()) {
        if (!rec.isObject()) {
            throw std::runtime_error("Batch member must be an object");
        }
        size_t id = rec["id"].getInt<int>();
        if (id >= num) {
            throw std::runtime_error("Batch member id is larger than batch size");
        }
        batch[id] = rec;
    }
    return batch;
}